

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O1

void duckdb::ListHasAllFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  undefined8 uVar3;
  long lVar4;
  ulong *puVar5;
  long lVar6;
  __buckets_ptr pp_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar8;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  char cVar11;
  int iVar12;
  BoundFunctionExpression *pBVar13;
  reference vector;
  reference vector_00;
  LogicalType *pLVar14;
  UnifiedVectorFormat *pUVar15;
  UnifiedVectorFormat *pUVar16;
  Vector *pVVar17;
  Vector *pVVar18;
  iterator iVar19;
  long lVar20;
  TemplatedValidityData<unsigned_long> *pTVar21;
  UnifiedVectorFormat *pUVar22;
  uint64_t idx_6;
  UnifiedVectorFormat *pUVar23;
  uint64_t idx_1;
  ulong uVar24;
  ulong uVar25;
  VectorType VVar26;
  uint64_t idx_2;
  ulong uVar27;
  uint64_t idx;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  uint64_t idx_12;
  UnifiedVectorFormat *pUVar32;
  uint64_t idx_10;
  ulong uVar33;
  bool bVar34;
  UnifiedVectorFormat UVar35;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat probe_format;
  UnifiedVectorFormat build_format;
  string_set_t set;
  Vector l_sortkey_vec;
  Vector r_sortkey_vec;
  ulong local_2e8;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2c0;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_2b8;
  long local_2b0;
  long local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_278;
  long *local_270 [2];
  long local_260;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_250;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  long *local_228 [2];
  long local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  UnifiedVectorFormat *local_1e0;
  UnifiedVectorFormat *local_1d8;
  unsigned_long local_1d0;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1c8;
  LogicalType local_190 [24];
  LogicalType local_178 [24];
  LogicalType local_160 [24];
  long *local_148;
  long local_140;
  long local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  LogicalType local_100 [8];
  LogicalType local_f8 [24];
  long local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Vector local_98 [8];
  LogicalType local_90 [24];
  long local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar13 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  iVar12 = std::__cxx11::string::compare((char *)(pBVar13 + 0x60));
  vector = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)args,(ulong)(iVar12 == 0));
  vector_00 = vector<duckdb::Vector,_true>::operator[]
                        ((vector<duckdb::Vector,_true> *)args,(ulong)(iVar12 != 0));
  pLVar14 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(vector + 8));
  duckdb::LogicalType::LogicalType(local_100,SQLNULL);
  cVar11 = duckdb::LogicalType::operator==(pLVar14,local_100);
  if (cVar11 == '\0') {
    cVar11 = '\0';
  }
  else {
    pLVar14 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(vector_00 + 8));
    duckdb::LogicalType::LogicalType(local_160,SQLNULL);
    cVar11 = duckdb::LogicalType::operator==(pLVar14,local_160);
    duckdb::LogicalType::~LogicalType(local_160);
  }
  duckdb::LogicalType::~LogicalType(local_100);
  VVar26 = (VectorType)result;
  if (cVar11 != '\0') {
    duckdb::Vector::SetVectorType(VVar26);
    **(undefined1 **)(result + 0x20) = 1;
    return;
  }
  pUVar15 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(vector);
  pUVar16 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(vector_00);
  pVVar17 = (Vector *)duckdb::ListVector::GetEntry(vector);
  pVVar18 = (Vector *)duckdb::ListVector::GetEntry(vector_00);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_228);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_270);
  duckdb::Vector::ToUnifiedFormat((ulong)pVVar17,pUVar15);
  duckdb::Vector::ToUnifiedFormat((ulong)pVVar18,pUVar16);
  duckdb::LogicalType::LogicalType(local_178,BLOB);
  duckdb::Vector::Vector((Vector *)local_100,local_178,pUVar15);
  duckdb::LogicalType::~LogicalType(local_178);
  duckdb::LogicalType::LogicalType(local_190,BLOB);
  duckdb::Vector::Vector(local_98,local_190,pUVar16);
  duckdb::LogicalType::~LogicalType(local_190);
  duckdb::CreateSortKeyHelpers::CreateSortKey
            (pVVar17,(ulong)pUVar15,(OrderModifiers)0x302,(Vector *)local_100);
  duckdb::CreateSortKeyHelpers::CreateSortKey(pVVar18,(ulong)pUVar16,(OrderModifiers)0x302,local_98)
  ;
  local_1c8._M_buckets = &local_1c8._M_single_bucket;
  local_1c8._M_bucket_count = 1;
  local_1c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1c8._M_element_count = 0;
  local_1c8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1c8._M_rehash_policy._M_next_resize = 0;
  local_1c8._M_single_bucket = (__node_base_ptr)0x0;
  vVar1 = *vector;
  vVar2 = *vector_00;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar26);
    uVar3 = *(undefined8 *)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      uVar27 = (*(ulong **)(vector_00 + 0x20))[1];
      if (uVar27 == 0) {
        bVar34 = true;
      }
      else {
        uVar28 = **(ulong **)(vector + 0x20);
        uVar24 = **(ulong **)(vector_00 + 0x20);
        uVar33 = (*(ulong **)(vector + 0x20))[1];
        std::
        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&local_1c8);
        if (uVar28 < uVar33 + uVar28) {
          do {
            uVar30 = uVar28;
            if (*local_228[0] != 0) {
              uVar30 = (ulong)*(uint *)(*local_228[0] + uVar28 * 4);
            }
            if ((local_218 == 0) ||
               ((*(ulong *)(local_218 + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1) != 0)) {
              local_2b8 = &local_1c8;
              std::
              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&local_1c8,uVar30 * 0x10 + local_e0,&local_2b8);
            }
            uVar28 = uVar28 + 1;
            uVar33 = uVar33 - 1;
          } while (uVar33 != 0);
        }
        uVar28 = uVar27 + uVar24;
        bVar34 = uVar28 <= uVar24;
        if (uVar24 < uVar28) {
          bVar34 = false;
          do {
            uVar33 = uVar24;
            if (*local_270[0] != 0) {
              uVar33 = (ulong)*(uint *)(*local_270[0] + uVar24 * 4);
            }
            if (((local_260 == 0) ||
                ((*(ulong *)(local_260 + (uVar33 >> 6) * 8) >> (uVar33 & 0x3f) & 1) != 0)) &&
               (iVar19 = std::
                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(&local_1c8,(key_type *)(uVar33 * 0x10 + local_78)),
               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur == (__node_type *)0x0
               )) break;
            uVar24 = uVar24 + 1;
            bVar34 = uVar28 <= uVar24;
            uVar27 = uVar27 - 1;
          } while (uVar27 != 0);
        }
      }
      *(bool *)uVar3 = bVar34;
      goto LAB_0068733b;
    }
  }
  else {
    pUVar15 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      lVar4 = *(long *)(vector + 0x20);
      puVar5 = *(ulong **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar26);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar15 != (UnifiedVectorFormat *)0x0) {
            uVar28 = *puVar5;
            uVar24 = puVar5[1];
            uVar27 = uVar24 + uVar28;
            pUVar16 = (UnifiedVectorFormat *)0x0;
            do {
              if (uVar24 == 0) {
                UVar35 = (UnifiedVectorFormat)0x1;
              }
              else {
                uVar33 = *(ulong *)(lVar4 + (long)pUVar16 * 0x10);
                lVar29 = *(long *)(lVar4 + 8 + (long)pUVar16 * 0x10);
                std::
                _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::clear(&local_1c8);
                if (uVar33 < lVar29 + uVar33) {
                  do {
                    uVar30 = uVar33;
                    if (*local_228[0] != 0) {
                      uVar30 = (ulong)*(uint *)(*local_228[0] + uVar33 * 4);
                    }
                    if ((local_218 == 0) ||
                       ((*(ulong *)(local_218 + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1) != 0)) {
                      local_2b8 = &local_1c8;
                      std::
                      _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      ::
                      _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                  *)&local_1c8,uVar30 * 0x10 + local_e0,&local_2b8);
                    }
                    uVar33 = uVar33 + 1;
                    lVar29 = lVar29 + -1;
                  } while (lVar29 != 0);
                }
                UVar35 = (UnifiedVectorFormat)(uVar27 <= uVar28);
                if (uVar28 < uVar27) {
                  UVar35 = (UnifiedVectorFormat)0x0;
                  uVar33 = uVar24;
                  uVar30 = uVar28;
                  do {
                    uVar25 = uVar30;
                    if (*local_270[0] != 0) {
                      uVar25 = (ulong)*(uint *)(*local_270[0] + uVar30 * 4);
                    }
                    if (((local_260 == 0) ||
                        ((*(ulong *)(local_260 + (uVar25 >> 6) * 8) >> (uVar25 & 0x3f) & 1) != 0))
                       && (iVar19 = std::
                                    _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                    ::find(&local_1c8,(key_type *)(uVar25 * 0x10 + local_78)),
                          iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                          (__node_type *)0x0)) break;
                    uVar30 = uVar30 + 1;
                    UVar35 = (UnifiedVectorFormat)(uVar27 <= uVar30);
                    uVar33 = uVar33 - 1;
                  } while (uVar33 != 0);
                }
              }
              pUVar16[lVar6] = UVar35;
              pUVar16 = pUVar16 + 1;
            } while (pUVar16 != pUVar15);
          }
        }
        else {
          local_1e0 = pUVar15 + 0x3f;
          if ((UnifiedVectorFormat *)0x3f < local_1e0) {
            local_1e0 = (UnifiedVectorFormat *)((ulong)local_1e0 >> 6);
            pUVar22 = (UnifiedVectorFormat *)0x0;
            pUVar16 = (UnifiedVectorFormat *)0x0;
            do {
              if (*(long *)(result + 0x28) == 0) {
                uVar27 = 0xffffffffffffffff;
              }
              else {
                uVar27 = *(ulong *)(*(long *)(result + 0x28) + (long)pUVar22 * 8);
              }
              pUVar32 = pUVar16 + 0x40;
              if (pUVar15 <= pUVar16 + 0x40) {
                pUVar32 = pUVar15;
              }
              pUVar23 = pUVar32;
              local_1d8 = pUVar22;
              if (uVar27 != 0) {
                pUVar23 = pUVar16;
                if (uVar27 == 0xffffffffffffffff) {
                  if (pUVar16 < pUVar32) {
                    uVar28 = *puVar5;
                    uVar24 = puVar5[1];
                    uVar27 = uVar24 + uVar28;
                    do {
                      if (uVar24 == 0) {
                        UVar35 = (UnifiedVectorFormat)0x1;
                      }
                      else {
                        uVar33 = *(ulong *)(lVar4 + (long)pUVar16 * 0x10);
                        lVar29 = *(long *)(lVar4 + 8 + (long)pUVar16 * 0x10);
                        std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_1c8);
                        if (uVar33 < uVar33 + lVar29) {
                          do {
                            uVar30 = uVar33;
                            if (*local_228[0] != 0) {
                              uVar30 = (ulong)*(uint *)(*local_228[0] + uVar33 * 4);
                            }
                            if ((local_218 == 0) ||
                               ((*(ulong *)(local_218 + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1)
                                != 0)) {
                              local_2b8 = &local_1c8;
                              std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)&local_1c8,uVar30 * 0x10 + local_e0,&local_2b8);
                            }
                            uVar33 = uVar33 + 1;
                            lVar29 = lVar29 + -1;
                          } while (lVar29 != 0);
                        }
                        UVar35 = (UnifiedVectorFormat)(uVar27 <= uVar28);
                        if (uVar28 < uVar27) {
                          UVar35 = (UnifiedVectorFormat)0x0;
                          uVar33 = uVar24;
                          uVar30 = uVar28;
                          do {
                            uVar25 = uVar30;
                            if (*local_270[0] != 0) {
                              uVar25 = (ulong)*(uint *)(*local_270[0] + uVar30 * 4);
                            }
                            if (((local_260 == 0) ||
                                ((*(ulong *)(local_260 + (uVar25 >> 6) * 8) >> (uVar25 & 0x3f) & 1)
                                 != 0)) &&
                               (iVar19 = std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_1c8,(key_type *)(uVar25 * 0x10 + local_78)),
                               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                               (__node_type *)0x0)) break;
                            uVar30 = uVar30 + 1;
                            UVar35 = (UnifiedVectorFormat)(uVar27 <= uVar30);
                            uVar33 = uVar33 - 1;
                          } while (uVar33 != 0);
                        }
                      }
                      pUVar16[lVar6] = UVar35;
                      pUVar16 = pUVar16 + 1;
                      pUVar23 = pUVar16;
                    } while (pUVar16 != pUVar32);
                  }
                }
                else if (pUVar16 < pUVar32) {
                  do {
                    if ((uVar27 >> ((ulong)(uint)((int)pUVar23 - (int)pUVar16) & 0x3f) & 1) != 0) {
                      uVar28 = puVar5[1];
                      if (uVar28 == 0) {
                        UVar35 = (UnifiedVectorFormat)0x1;
                      }
                      else {
                        uVar24 = *puVar5;
                        uVar33 = *(ulong *)(lVar4 + (long)pUVar23 * 0x10);
                        lVar29 = *(long *)(lVar4 + 8 + (long)pUVar23 * 0x10);
                        std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_1c8);
                        if (uVar33 < uVar33 + lVar29) {
                          do {
                            uVar30 = uVar33;
                            if (*local_228[0] != 0) {
                              uVar30 = (ulong)*(uint *)(*local_228[0] + uVar33 * 4);
                            }
                            if ((local_218 == 0) ||
                               ((*(ulong *)(local_218 + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1)
                                != 0)) {
                              local_2b8 = &local_1c8;
                              std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)&local_1c8,uVar30 * 0x10 + local_e0,&local_2b8);
                            }
                            uVar33 = uVar33 + 1;
                            lVar29 = lVar29 + -1;
                          } while (lVar29 != 0);
                        }
                        uVar33 = uVar28 + uVar24;
                        UVar35 = (UnifiedVectorFormat)(uVar33 <= uVar24);
                        if (uVar24 < uVar33) {
                          UVar35 = (UnifiedVectorFormat)0x0;
                          do {
                            uVar30 = uVar24;
                            if (*local_270[0] != 0) {
                              uVar30 = (ulong)*(uint *)(*local_270[0] + uVar24 * 4);
                            }
                            if (((local_260 == 0) ||
                                ((*(ulong *)(local_260 + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1)
                                 != 0)) &&
                               (iVar19 = std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_1c8,(key_type *)(uVar30 * 0x10 + local_78)),
                               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                               (__node_type *)0x0)) break;
                            uVar24 = uVar24 + 1;
                            UVar35 = (UnifiedVectorFormat)(uVar33 <= uVar24);
                            uVar28 = uVar28 - 1;
                          } while (uVar28 != 0);
                        }
                      }
                      pUVar23[lVar6] = UVar35;
                    }
                    pUVar23 = pUVar23 + 1;
                  } while (pUVar23 != pUVar32);
                }
              }
              pUVar22 = local_1d8 + 1;
              pUVar16 = pUVar23;
            } while (pUVar22 != local_1e0);
          }
        }
        goto LAB_0068733b;
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar4 = *(long *)(vector + 0x20);
          lVar6 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar26);
          lVar29 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          pVVar17 = result + 0x28;
          duckdb::ValidityMask::Combine((ValidityMask *)pVVar17,(ulong)(vector_00 + 0x28));
          if (*(long *)pVVar17 == 0) {
            if (pUVar15 != (UnifiedVectorFormat *)0x0) {
              pUVar16 = (UnifiedVectorFormat *)0x0;
              do {
                lVar20 = (long)pUVar16 * 0x10;
                lVar31 = *(long *)(lVar6 + 8 + lVar20);
                if (lVar31 == 0) {
                  UVar35 = (UnifiedVectorFormat)0x1;
                }
                else {
                  uVar27 = *(ulong *)(lVar6 + lVar20);
                  uVar28 = *(ulong *)(lVar4 + lVar20);
                  lVar20 = *(long *)(lVar4 + 8 + lVar20);
                  std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_1c8);
                  if (uVar28 < uVar28 + lVar20) {
                    do {
                      uVar24 = uVar28;
                      if (*local_228[0] != 0) {
                        uVar24 = (ulong)*(uint *)(*local_228[0] + uVar28 * 4);
                      }
                      if ((local_218 == 0) ||
                         ((*(ulong *)(local_218 + (uVar24 >> 6) * 8) >> (uVar24 & 0x3f) & 1) != 0))
                      {
                        local_2b8 = &local_1c8;
                        std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&local_1c8,uVar24 * 0x10 + local_e0,&local_2b8);
                      }
                      uVar28 = uVar28 + 1;
                      lVar20 = lVar20 + -1;
                    } while (lVar20 != 0);
                  }
                  uVar28 = lVar31 + uVar27;
                  UVar35 = (UnifiedVectorFormat)(uVar28 <= uVar27);
                  if (uVar27 < uVar28) {
                    UVar35 = (UnifiedVectorFormat)0x0;
                    do {
                      uVar24 = uVar27;
                      if (*local_270[0] != 0) {
                        uVar24 = (ulong)*(uint *)(*local_270[0] + uVar27 * 4);
                      }
                      if (((local_260 == 0) ||
                          ((*(ulong *)(local_260 + (uVar24 >> 6) * 8) >> (uVar24 & 0x3f) & 1) != 0))
                         && (iVar19 = std::
                                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                      ::find(&local_1c8,(key_type *)(uVar24 * 0x10 + local_78)),
                            iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                            (__node_type *)0x0)) break;
                      uVar27 = uVar27 + 1;
                      UVar35 = (UnifiedVectorFormat)(uVar28 <= uVar27);
                      lVar31 = lVar31 + -1;
                    } while (lVar31 != 0);
                  }
                }
                pUVar16[lVar29] = UVar35;
                pUVar16 = pUVar16 + 1;
              } while (pUVar16 != pUVar15);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < pUVar15 + 0x3f) {
            pUVar16 = (UnifiedVectorFormat *)0x0;
            local_2e8 = 0;
            do {
              if (*(long *)pVVar17 == 0) {
                uVar27 = 0xffffffffffffffff;
              }
              else {
                uVar27 = *(ulong *)(*(long *)pVVar17 + local_2e8 * 8);
              }
              pUVar22 = pUVar16 + 0x40;
              if (pUVar15 <= pUVar16 + 0x40) {
                pUVar22 = pUVar15;
              }
              pUVar32 = pUVar22;
              if (uVar27 != 0) {
                pUVar32 = pUVar16;
                if (uVar27 == 0xffffffffffffffff) {
                  if (pUVar16 < pUVar22) {
                    do {
                      lVar20 = (long)pUVar16 * 0x10;
                      lVar31 = *(long *)(lVar6 + 8 + lVar20);
                      if (lVar31 == 0) {
                        UVar35 = (UnifiedVectorFormat)0x1;
                      }
                      else {
                        uVar27 = *(ulong *)(lVar6 + lVar20);
                        uVar28 = *(ulong *)(lVar4 + lVar20);
                        lVar20 = *(long *)(lVar4 + 8 + lVar20);
                        std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_1c8);
                        if (uVar28 < uVar28 + lVar20) {
                          do {
                            uVar24 = uVar28;
                            if (*local_228[0] != 0) {
                              uVar24 = (ulong)*(uint *)(*local_228[0] + uVar28 * 4);
                            }
                            if ((local_218 == 0) ||
                               ((*(ulong *)(local_218 + (uVar24 >> 6) * 8) >> (uVar24 & 0x3f) & 1)
                                != 0)) {
                              local_2b8 = &local_1c8;
                              std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)&local_1c8,uVar24 * 0x10 + local_e0,&local_2b8);
                            }
                            uVar28 = uVar28 + 1;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                        uVar28 = uVar27 + lVar31;
                        UVar35 = (UnifiedVectorFormat)(uVar28 <= uVar27);
                        if (uVar27 < uVar28) {
                          UVar35 = (UnifiedVectorFormat)0x0;
                          do {
                            uVar24 = uVar27;
                            if (*local_270[0] != 0) {
                              uVar24 = (ulong)*(uint *)(*local_270[0] + uVar27 * 4);
                            }
                            if (((local_260 == 0) ||
                                ((*(ulong *)(local_260 + (uVar24 >> 6) * 8) >> (uVar24 & 0x3f) & 1)
                                 != 0)) &&
                               (iVar19 = std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_1c8,(key_type *)(uVar24 * 0x10 + local_78)),
                               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                               (__node_type *)0x0)) break;
                            uVar27 = uVar27 + 1;
                            UVar35 = (UnifiedVectorFormat)(uVar28 <= uVar27);
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                      }
                      pUVar16[lVar29] = UVar35;
                      pUVar16 = pUVar16 + 1;
                      pUVar32 = pUVar16;
                    } while (pUVar16 != pUVar22);
                  }
                }
                else if (pUVar16 < pUVar22) {
                  do {
                    if ((uVar27 >> ((ulong)(uint)((int)pUVar32 - (int)pUVar16) & 0x3f) & 1) != 0) {
                      lVar20 = (long)pUVar32 * 0x10;
                      lVar31 = *(long *)(lVar6 + 8 + lVar20);
                      if (lVar31 == 0) {
                        UVar35 = (UnifiedVectorFormat)0x1;
                      }
                      else {
                        uVar28 = *(ulong *)(lVar6 + lVar20);
                        uVar24 = *(ulong *)(lVar4 + lVar20);
                        lVar20 = *(long *)(lVar4 + 8 + lVar20);
                        std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_1c8);
                        if (uVar24 < uVar24 + lVar20) {
                          do {
                            uVar33 = uVar24;
                            if (*local_228[0] != 0) {
                              uVar33 = (ulong)*(uint *)(*local_228[0] + uVar24 * 4);
                            }
                            if ((local_218 == 0) ||
                               ((*(ulong *)(local_218 + (uVar33 >> 6) * 8) >> (uVar33 & 0x3f) & 1)
                                != 0)) {
                              local_2b8 = &local_1c8;
                              std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)&local_1c8,uVar33 * 0x10 + local_e0,&local_2b8);
                            }
                            uVar24 = uVar24 + 1;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                        uVar24 = lVar31 + uVar28;
                        UVar35 = (UnifiedVectorFormat)(uVar24 <= uVar28);
                        if (uVar28 < uVar24) {
                          UVar35 = (UnifiedVectorFormat)0x0;
                          do {
                            uVar33 = uVar28;
                            if (*local_270[0] != 0) {
                              uVar33 = (ulong)*(uint *)(*local_270[0] + uVar28 * 4);
                            }
                            if (((local_260 == 0) ||
                                ((*(ulong *)(local_260 + (uVar33 >> 6) * 8) >> (uVar33 & 0x3f) & 1)
                                 != 0)) &&
                               (iVar19 = std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_1c8,(key_type *)(uVar33 * 0x10 + local_78)),
                               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                               (__node_type *)0x0)) break;
                            uVar28 = uVar28 + 1;
                            UVar35 = (UnifiedVectorFormat)(uVar24 <= uVar28);
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                      }
                      pUVar32[lVar29] = UVar35;
                    }
                    pUVar32 = pUVar32 + 1;
                  } while (pUVar32 != pUVar22);
                }
              }
              pUVar16 = pUVar32;
              local_2e8 = local_2e8 + 1;
            } while (local_2e8 != (ulong)(pUVar15 + 0x3f) >> 6);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_2b8);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_148);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar15);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar15);
          duckdb::Vector::SetVectorType(VVar26);
          p_Var9 = local_2b8;
          lVar4 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_138 == 0 && local_2a8 == 0) {
            if (pUVar15 != (UnifiedVectorFormat *)0x0) {
              pp_Var7 = p_Var9->_M_buckets;
              lVar6 = *local_148;
              pUVar16 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar22 = pUVar16;
                if (pp_Var7 != (__buckets_ptr)0x0) {
                  pUVar22 = (UnifiedVectorFormat *)
                            (ulong)*(uint *)((long)pp_Var7 + (long)pUVar16 * 4);
                }
                pUVar32 = pUVar16;
                if (lVar6 != 0) {
                  pUVar32 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar16 * 4);
                }
                lVar29 = *(long *)(local_140 + 8 + (long)pUVar32 * 0x10);
                if (lVar29 == 0) {
                  UVar35 = (UnifiedVectorFormat)0x1;
                }
                else {
                  uVar27 = *(ulong *)(local_2b0 + (long)pUVar22 * 0x10);
                  lVar31 = *(long *)(local_2b0 + 8 + (long)pUVar22 * 0x10);
                  uVar28 = *(ulong *)(local_140 + (long)pUVar32 * 0x10);
                  std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_1c8);
                  if (uVar27 < uVar27 + lVar31) {
                    do {
                      uVar24 = uVar27;
                      if (*local_228[0] != 0) {
                        uVar24 = (ulong)*(uint *)(*local_228[0] + uVar27 * 4);
                      }
                      if ((local_218 == 0) ||
                         ((*(ulong *)(local_218 + (uVar24 >> 6) * 8) >> (uVar24 & 0x3f) & 1) != 0))
                      {
                        local_2c8 = &local_1c8;
                        std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&local_1c8,uVar24 * 0x10 + local_e0,&local_2c8);
                      }
                      uVar27 = uVar27 + 1;
                      lVar31 = lVar31 + -1;
                    } while (lVar31 != 0);
                  }
                  uVar27 = lVar29 + uVar28;
                  UVar35 = (UnifiedVectorFormat)(uVar27 <= uVar28);
                  if (uVar28 < uVar27) {
                    UVar35 = (UnifiedVectorFormat)0x0;
                    do {
                      uVar24 = uVar28;
                      if (*local_270[0] != 0) {
                        uVar24 = (ulong)*(uint *)(*local_270[0] + uVar28 * 4);
                      }
                      if (((local_260 == 0) ||
                          ((*(ulong *)(local_260 + (uVar24 >> 6) * 8) >> (uVar24 & 0x3f) & 1) != 0))
                         && (iVar19 = std::
                                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                      ::find(&local_1c8,(key_type *)(uVar24 * 0x10 + local_78)),
                            iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                            (__node_type *)0x0)) break;
                      uVar28 = uVar28 + 1;
                      UVar35 = (UnifiedVectorFormat)(uVar27 <= uVar28);
                      lVar29 = lVar29 + -1;
                    } while (lVar29 != 0);
                  }
                }
                pUVar16[lVar4] = UVar35;
                pUVar16 = pUVar16 + 1;
              } while (pUVar16 != pUVar15);
            }
          }
          else if (pUVar15 != (UnifiedVectorFormat *)0x0) {
            pp_Var7 = p_Var9->_M_buckets;
            lVar6 = *local_148;
            pUVar16 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar22 = pUVar16;
              if (pp_Var7 != (__buckets_ptr)0x0) {
                pUVar22 = (UnifiedVectorFormat *)(ulong)*(uint *)((long)pp_Var7 + (long)pUVar16 * 4)
                ;
              }
              pUVar32 = pUVar16;
              if (lVar6 != 0) {
                pUVar32 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar16 * 4);
              }
              if (((local_2a8 == 0) ||
                  ((*(ulong *)(local_2a8 + ((ulong)pUVar22 >> 6) * 8) >> ((ulong)pUVar22 & 0x3f) & 1
                   ) != 0)) &&
                 ((local_138 == 0 ||
                  ((*(ulong *)(local_138 + ((ulong)pUVar32 >> 6) * 8) >> ((ulong)pUVar32 & 0x3f) & 1
                   ) != 0)))) {
                lVar29 = *(long *)(local_140 + 8 + (long)pUVar32 * 0x10);
                if (lVar29 == 0) {
                  UVar35 = (UnifiedVectorFormat)0x1;
                }
                else {
                  uVar27 = *(ulong *)(local_140 + (long)pUVar32 * 0x10);
                  uVar28 = *(ulong *)(local_2b0 + (long)pUVar22 * 0x10);
                  lVar31 = *(long *)(local_2b0 + 8 + (long)pUVar22 * 0x10);
                  std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_1c8);
                  if (uVar28 < uVar28 + lVar31) {
                    do {
                      uVar24 = uVar28;
                      if (*local_228[0] != 0) {
                        uVar24 = (ulong)*(uint *)(*local_228[0] + uVar28 * 4);
                      }
                      if ((local_218 == 0) ||
                         ((*(ulong *)(local_218 + (uVar24 >> 6) * 8) >> (uVar24 & 0x3f) & 1) != 0))
                      {
                        local_2c8 = &local_1c8;
                        std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&local_1c8,uVar24 * 0x10 + local_e0,&local_2c8);
                      }
                      uVar28 = uVar28 + 1;
                      lVar31 = lVar31 + -1;
                    } while (lVar31 != 0);
                  }
                  uVar28 = uVar27 + lVar29;
                  UVar35 = (UnifiedVectorFormat)(uVar28 <= uVar27);
                  if (uVar27 < uVar28) {
                    UVar35 = (UnifiedVectorFormat)0x0;
                    do {
                      uVar24 = uVar27;
                      if (*local_270[0] != 0) {
                        uVar24 = (ulong)*(uint *)(*local_270[0] + uVar27 * 4);
                      }
                      if (((local_260 == 0) ||
                          ((*(ulong *)(local_260 + (uVar24 >> 6) * 8) >> (uVar24 & 0x3f) & 1) != 0))
                         && (iVar19 = std::
                                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                      ::find(&local_1c8,(key_type *)(uVar24 * 0x10 + local_78)),
                            iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                            (__node_type *)0x0)) break;
                      uVar27 = uVar27 + 1;
                      UVar35 = (UnifiedVectorFormat)(uVar28 <= uVar27);
                      lVar29 = lVar29 + -1;
                    } while (lVar29 != 0);
                  }
                }
                pUVar16[lVar4] = UVar35;
              }
              else {
                if (*(long *)(result + 0x28) == 0) {
                  local_1d0 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_2c8,&local_1d0);
                  p_Var10 = p_Stack_2c0;
                  p_Var9 = local_2c8;
                  local_2c8 = (_Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)0x0;
                  p_Stack_2c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(_Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    **)(result + 0x30) = p_Var9;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2c0);
                  }
                  pTVar21 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  *(unsigned_long **)(result + 0x28) =
                       (pTVar21->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                }
                bVar8 = (byte)pUVar16 & 0x3f;
                puVar5 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar16 >> 6) * 8);
                *puVar5 = *puVar5 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              }
              pUVar16 = pUVar16 + 1;
            } while (pUVar16 != pUVar15);
          }
          if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
          }
          if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
          }
          if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
          }
          if (local_298 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298);
          }
        }
        goto LAB_0068733b;
      }
      puVar5 = *(ulong **)(vector + 0x20);
      lVar4 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar26);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar15 != (UnifiedVectorFormat *)0x0) {
            uVar27 = *puVar5;
            pUVar16 = (UnifiedVectorFormat *)0x0;
            do {
              lVar29 = *(long *)(lVar4 + 8 + (long)pUVar16 * 0x10);
              if (lVar29 == 0) {
                UVar35 = (UnifiedVectorFormat)0x1;
              }
              else {
                uVar28 = *(ulong *)(lVar4 + (long)pUVar16 * 0x10);
                uVar24 = puVar5[1];
                std::
                _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::clear(&local_1c8);
                uVar33 = uVar27;
                if (uVar27 < uVar24 + uVar27) {
                  do {
                    uVar30 = uVar33;
                    if (*local_228[0] != 0) {
                      uVar30 = (ulong)*(uint *)(*local_228[0] + uVar33 * 4);
                    }
                    if ((local_218 == 0) ||
                       ((*(ulong *)(local_218 + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1) != 0)) {
                      local_2b8 = &local_1c8;
                      std::
                      _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      ::
                      _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                  *)&local_1c8,uVar30 * 0x10 + local_e0,&local_2b8);
                    }
                    uVar33 = uVar33 + 1;
                    uVar24 = uVar24 - 1;
                  } while (uVar24 != 0);
                }
                uVar24 = uVar28 + lVar29;
                UVar35 = (UnifiedVectorFormat)(uVar24 <= uVar28);
                if (uVar28 < uVar24) {
                  UVar35 = (UnifiedVectorFormat)0x0;
                  do {
                    uVar33 = uVar28;
                    if (*local_270[0] != 0) {
                      uVar33 = (ulong)*(uint *)(*local_270[0] + uVar28 * 4);
                    }
                    if (((local_260 == 0) ||
                        ((*(ulong *)(local_260 + (uVar33 >> 6) * 8) >> (uVar33 & 0x3f) & 1) != 0))
                       && (iVar19 = std::
                                    _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                    ::find(&local_1c8,(key_type *)(uVar33 * 0x10 + local_78)),
                          iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur ==
                          (__node_type *)0x0)) break;
                    uVar28 = uVar28 + 1;
                    UVar35 = (UnifiedVectorFormat)(uVar24 <= uVar28);
                    lVar29 = lVar29 + -1;
                  } while (lVar29 != 0);
                }
              }
              pUVar16[lVar6] = UVar35;
              pUVar16 = pUVar16 + 1;
            } while (pUVar16 != pUVar15);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < pUVar15 + 0x3f) {
          pUVar16 = (UnifiedVectorFormat *)0x0;
          local_2e8 = 0;
          do {
            if (*(long *)(result + 0x28) == 0) {
              uVar27 = 0xffffffffffffffff;
            }
            else {
              uVar27 = *(ulong *)(*(long *)(result + 0x28) + local_2e8 * 8);
            }
            pUVar22 = pUVar16 + 0x40;
            if (pUVar15 <= pUVar16 + 0x40) {
              pUVar22 = pUVar15;
            }
            pUVar32 = pUVar22;
            if (uVar27 != 0) {
              pUVar32 = pUVar16;
              if (uVar27 == 0xffffffffffffffff) {
                if (pUVar16 < pUVar22) {
                  uVar27 = *puVar5;
                  do {
                    lVar29 = *(long *)(lVar4 + 8 + (long)pUVar16 * 0x10);
                    if (lVar29 == 0) {
                      UVar35 = (UnifiedVectorFormat)0x1;
                    }
                    else {
                      uVar28 = *(ulong *)(lVar4 + (long)pUVar16 * 0x10);
                      uVar24 = puVar5[1];
                      std::
                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::clear(&local_1c8);
                      uVar33 = uVar27;
                      if (uVar27 < uVar24 + uVar27) {
                        do {
                          uVar30 = uVar33;
                          if (*local_228[0] != 0) {
                            uVar30 = (ulong)*(uint *)(*local_228[0] + uVar33 * 4);
                          }
                          if ((local_218 == 0) ||
                             ((*(ulong *)(local_218 + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1) !=
                              0)) {
                            local_2b8 = &local_1c8;
                            std::
                            _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            ::
                            _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                      ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                        *)&local_1c8,uVar30 * 0x10 + local_e0,&local_2b8);
                          }
                          uVar33 = uVar33 + 1;
                          uVar24 = uVar24 - 1;
                        } while (uVar24 != 0);
                      }
                      uVar24 = uVar28 + lVar29;
                      UVar35 = (UnifiedVectorFormat)(uVar24 <= uVar28);
                      if (uVar28 < uVar24) {
                        UVar35 = (UnifiedVectorFormat)0x0;
                        do {
                          uVar33 = uVar28;
                          if (*local_270[0] != 0) {
                            uVar33 = (ulong)*(uint *)(*local_270[0] + uVar28 * 4);
                          }
                          if (((local_260 == 0) ||
                              ((*(ulong *)(local_260 + (uVar33 >> 6) * 8) >> (uVar33 & 0x3f) & 1) !=
                               0)) && (iVar19 = std::
                                                _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                                ::find(&local_1c8,
                                                       (key_type *)(uVar33 * 0x10 + local_78)),
                                      iVar19.super__Node_iterator_base<duckdb::string_t,_true>.
                                      _M_cur == (__node_type *)0x0)) break;
                          uVar28 = uVar28 + 1;
                          UVar35 = (UnifiedVectorFormat)(uVar24 <= uVar28);
                          lVar29 = lVar29 + -1;
                        } while (lVar29 != 0);
                      }
                    }
                    pUVar16[lVar6] = UVar35;
                    pUVar16 = pUVar16 + 1;
                    pUVar32 = pUVar16;
                  } while (pUVar16 != pUVar22);
                }
              }
              else if (pUVar16 < pUVar22) {
                do {
                  if ((uVar27 >> ((ulong)(uint)((int)pUVar32 - (int)pUVar16) & 0x3f) & 1) != 0) {
                    lVar29 = *(long *)(lVar4 + 8 + (long)pUVar32 * 0x10);
                    if (lVar29 == 0) {
                      UVar35 = (UnifiedVectorFormat)0x1;
                    }
                    else {
                      uVar28 = *(ulong *)(lVar4 + (long)pUVar32 * 0x10);
                      uVar24 = *puVar5;
                      uVar33 = puVar5[1];
                      std::
                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::clear(&local_1c8);
                      if (uVar24 < uVar24 + uVar33) {
                        do {
                          uVar30 = uVar24;
                          if (*local_228[0] != 0) {
                            uVar30 = (ulong)*(uint *)(*local_228[0] + uVar24 * 4);
                          }
                          if ((local_218 == 0) ||
                             ((*(ulong *)(local_218 + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1) !=
                              0)) {
                            local_2b8 = &local_1c8;
                            std::
                            _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            ::
                            _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                      ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                        *)&local_1c8,uVar30 * 0x10 + local_e0,&local_2b8);
                          }
                          uVar24 = uVar24 + 1;
                          uVar33 = uVar33 - 1;
                        } while (uVar33 != 0);
                      }
                      uVar24 = lVar29 + uVar28;
                      UVar35 = (UnifiedVectorFormat)(uVar24 <= uVar28);
                      if (uVar28 < uVar24) {
                        UVar35 = (UnifiedVectorFormat)0x0;
                        do {
                          uVar33 = uVar28;
                          if (*local_270[0] != 0) {
                            uVar33 = (ulong)*(uint *)(*local_270[0] + uVar28 * 4);
                          }
                          if (((local_260 == 0) ||
                              ((*(ulong *)(local_260 + (uVar33 >> 6) * 8) >> (uVar33 & 0x3f) & 1) !=
                               0)) && (iVar19 = std::
                                                _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                                ::find(&local_1c8,
                                                       (key_type *)(uVar33 * 0x10 + local_78)),
                                      iVar19.super__Node_iterator_base<duckdb::string_t,_true>.
                                      _M_cur == (__node_type *)0x0)) break;
                          uVar28 = uVar28 + 1;
                          UVar35 = (UnifiedVectorFormat)(uVar24 <= uVar28);
                          lVar29 = lVar29 + -1;
                        } while (lVar29 != 0);
                      }
                    }
                    pUVar32[lVar6] = UVar35;
                  }
                  pUVar32 = pUVar32 + 1;
                } while (pUVar32 != pUVar22);
              }
            }
            pUVar16 = pUVar32;
            local_2e8 = local_2e8 + 1;
          } while (local_2e8 != (ulong)(pUVar15 + 0x3f) >> 6);
        }
        goto LAB_0068733b;
      }
    }
    duckdb::Vector::SetVectorType(VVar26);
  }
  duckdb::ConstantVector::SetNull(result,true);
LAB_0068733b:
  std::
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1c8);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  duckdb::LogicalType::~LogicalType(local_f8);
  if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230);
  }
  if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250);
  }
  if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
  }
  if (local_208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_208);
  }
  return;
}

Assistant:

static void ListHasAllFunction(DataChunk &args, ExpressionState &state, Vector &result) {

	const auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	const auto swap = func_expr.function.name == "<@";

	auto &l_vec = args.data[swap ? 1 : 0];
	auto &r_vec = args.data[swap ? 0 : 1];

	if (ListType::GetChildType(l_vec.GetType()) == LogicalType::SQLNULL &&
	    ListType::GetChildType(r_vec.GetType()) == LogicalType::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<bool>(result)[0] = true;
		return;
	}

	const auto l_size = ListVector::GetListSize(l_vec);
	const auto r_size = ListVector::GetListSize(r_vec);

	auto &l_child = ListVector::GetEntry(l_vec);
	auto &r_child = ListVector::GetEntry(r_vec);

	// Setup unified formats for the list elements
	UnifiedVectorFormat build_format;
	UnifiedVectorFormat probe_format;

	l_child.ToUnifiedFormat(l_size, build_format);
	r_child.ToUnifiedFormat(r_size, probe_format);

	// Create the sort keys for the list elements
	Vector l_sortkey_vec(LogicalType::BLOB, l_size);
	Vector r_sortkey_vec(LogicalType::BLOB, r_size);

	const OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);

	CreateSortKeyHelpers::CreateSortKey(l_child, l_size, order_modifiers, l_sortkey_vec);
	CreateSortKeyHelpers::CreateSortKey(r_child, r_size, order_modifiers, r_sortkey_vec);

	const auto build_data = FlatVector::GetData<string_t>(l_sortkey_vec);
	const auto probe_data = FlatVector::GetData<string_t>(r_sortkey_vec);

	string_set_t set;

	BinaryExecutor::Execute<list_entry_t, list_entry_t, bool>(
	    l_vec, r_vec, result, args.size(), [&](const list_entry_t &build_list, const list_entry_t &probe_list) {
		    // Short circuit if the probe list is empty
		    if (probe_list.length == 0) {
			    return true;
		    }

		    // Reset the set
		    set.clear();

		    // Build the set
		    for (auto idx = build_list.offset; idx < build_list.offset + build_list.length; idx++) {
			    const auto entry_idx = build_format.sel->get_index(idx);
			    if (build_format.validity.RowIsValid(entry_idx)) {
				    set.insert(build_data[entry_idx]);
			    }
		    }

		    // Probe the set
		    for (auto idx = probe_list.offset; idx < probe_list.offset + probe_list.length; idx++) {
			    const auto entry_idx = probe_format.sel->get_index(idx);
			    if (probe_format.validity.RowIsValid(entry_idx) && set.find(probe_data[entry_idx]) == set.end()) {
				    return false;
			    }
		    }
		    return true;
	    });
}